

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O1

void duckdb::RLEScanPartialInternal<signed_char,true>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  byte bVar1;
  data_ptr_t pdVar2;
  RLEScanState<signed_char> *scan_state;
  idx_t iVar3;
  data_ptr_t data_pointer;
  ulong uVar4;
  ulong __n;
  ulong uVar5;
  rle_count_t *index_pointer;
  
  scan_state = (RLEScanState<signed_char> *)
               unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
               ::operator->(&state->scan_state);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(scan_state->handle).node);
  pdVar2 = ((scan_state->handle).node.ptr)->buffer;
  data_pointer = pdVar2 + segment->offset + 8;
  index_pointer = (rle_count_t *)(pdVar2 + (ulong)scan_state->rle_count_offset + segment->offset);
  if ((scan_count == 0x800) &&
     (0x7ff < (ulong)index_pointer[scan_state->entry_pos] - scan_state->position_in_entry)) {
    RLEScanConstant<signed_char>(scan_state,index_pointer,(char *)data_pointer,0x800,result);
    return;
  }
  pdVar2 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  uVar5 = scan_count + result_offset;
  do {
    uVar4 = uVar5 - result_offset;
    if (uVar5 < result_offset || uVar4 == 0) {
      return;
    }
    __n = (ulong)index_pointer[scan_state->entry_pos] - scan_state->position_in_entry;
    bVar1 = data_pointer[scan_state->entry_pos];
    if (uVar4 < __n) {
      switchD_0105b559::default(pdVar2 + result_offset,(uint)bVar1,uVar4 + (uVar4 == 0));
      iVar3 = scan_state->position_in_entry + uVar4;
    }
    else {
      if ((ulong)index_pointer[scan_state->entry_pos] != scan_state->position_in_entry) {
        switchD_0105b559::default(pdVar2 + result_offset,(uint)bVar1,__n);
      }
      result_offset = result_offset + __n;
      scan_state->entry_pos = scan_state->entry_pos + 1;
      iVar3 = 0;
    }
    scan_state->position_in_entry = iVar3;
  } while (__n <= uVar4);
  return;
}

Assistant:

void RLEScanPartialInternal(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                            idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run
	if (CanEmitConstantVector<ENTIRE_VECTOR>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos],
	                                         scan_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, scan_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t result_end = result_offset + scan_count;
	while (result_offset < result_end) {
		rle_count_t run_end = index_pointer[scan_state.entry_pos];
		idx_t run_count = run_end - scan_state.position_in_entry;
		idx_t remaining_scan_count = result_end - result_offset;
		T element = data_pointer[scan_state.entry_pos];
		if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
			for (idx_t i = 0; i < remaining_scan_count; i++) {
				result_data[result_offset + i] = element;
			}
			scan_state.position_in_entry += remaining_scan_count;
			break;
		}

		for (idx_t i = 0; i < run_count; i++) {
			result_data[result_offset + i] = element;
		}

		result_offset += run_count;
		scan_state.ForwardToNextRun();
	}
}